

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O3

void __thiscall
asio::detail::
timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::up_heap(timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          *this,size_t index)

{
  ulong uVar1;
  pointer phVar2;
  duration dVar3;
  per_timer_data *ppVar4;
  per_timer_data *ppVar5;
  pointer phVar6;
  ulong uVar7;
  
  if (index != 0) {
    phVar6 = (this->heap_).
             super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar1 = index - 1;
      uVar7 = uVar1 >> 1;
      if (phVar6[uVar7].time_.__d.__r <= phVar6[index].time_.__d.__r) {
        return;
      }
      phVar2 = phVar6 + index;
      dVar3.__r = (phVar2->time_).__d.__r;
      ppVar4 = phVar2->timer_;
      ppVar5 = phVar6[uVar7].timer_;
      (phVar2->time_).__d.__r = phVar6[uVar7].time_.__d.__r;
      phVar2->timer_ = ppVar5;
      phVar6 = (this->heap_).
               super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar7;
      (phVar6->time_).__d.__r = dVar3.__r;
      phVar6->timer_ = ppVar4;
      phVar6 = (this->heap_).
               super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (phVar6[index].timer_)->heap_index_ = index;
      (phVar6[uVar7].timer_)->heap_index_ = uVar7;
      index = uVar7;
    } while (1 < uVar1);
  }
  return;
}

Assistant:

void up_heap(std::size_t index)
  {
    while (index > 0)
    {
      std::size_t parent = (index - 1) / 2;
      if (!Time_Traits::less_than(heap_[index].time_, heap_[parent].time_))
        break;
      swap_heap(index, parent);
      index = parent;
    }
  }